

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O1

void __thiscall Samba::Samba(Samba *this)

{
  this->_vptr_Samba = (_func_int **)&PTR__Samba_00119558;
  this->_canChipErase = false;
  this->_canWriteBuffer = false;
  this->_canChecksumBuffer = false;
  this->_readBufferSize = 0;
  this->_debug = false;
  this->_isUsb = false;
  (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
  super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
  super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl = (SerialPort *)0x0;
  return;
}

Assistant:

Samba::Samba() :
    _canChipErase(false),
    _canWriteBuffer(false),
    _canChecksumBuffer(false),
    _readBufferSize(0),
    _debug(false),
    _isUsb(false)
{
}